

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastReplace
          (Lowerer *this,Opnd *strOpnd,Opnd *src1,Opnd *src2,Instr *callInstr,Instr *insertInstr,
          LabelInstr *labelHelper,LabelInstr *doneLabel)

{
  LowererMD *this_00;
  ScriptContextInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  int iVar5;
  BailOutKind BVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  AddrOpnd *compareSrc2;
  Lowerer *pLVar8;
  IndirOpnd *compareSrc1;
  Instr *this_01;
  BailOutInfo *bailoutInfo;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar9;
  Lowerer *this_02;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  Opnd *local_38;
  
  local_38 = callInstr->m_dst;
  local_40 = (strOpnd->m_valueType).field_0;
  bVar3 = ValueType::IsLikelyString((ValueType *)&local_40.field_0);
  if (bVar3) {
    local_3e = (src2->m_valueType).field_0;
    bVar3 = ValueType::IsLikelyString((ValueType *)&local_3e.field_0);
    if (!bVar3) goto LAB_005e193d;
  }
  else {
LAB_005e193d:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4fcf,
                       "(strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString())"
                       ,
                       "strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString()"
                      );
    if (!bVar3) goto LAB_005e1d09;
    *puVar7 = 0;
  }
  local_3c = (strOpnd->m_valueType).field_0;
  paVar9 = &local_3c;
  bVar3 = ValueType::IsString((ValueType *)&paVar9->field_0);
  if (!bVar3) {
    strOpnd = &GetRegOpnd((Lowerer *)&paVar9->field_0,strOpnd,insertInstr,this->m_func,TyVar)->
               super_Opnd;
    OVar4 = IR::Opnd::GetKind(strOpnd);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005e1d09;
      *puVar7 = 0;
    }
    GenerateStringTest(this,(RegOpnd *)strOpnd,insertInstr,labelHelper,(LabelInstr *)0x0,true);
  }
  bVar3 = IR::Opnd::IsNotTaggedValue(src1);
  if (!bVar3) {
    LowererMD::GenerateObjectTest(&this->m_lowererMD,src1,insertInstr,labelHelper,false);
  }
  pSVar1 = insertInstr->m_func->m_scriptContextInfo;
  iVar5 = (*pSVar1->_vptr_ScriptContextInfo[0x21])(pSVar1,0x23);
  pLVar8 = (Lowerer *)CONCAT44(extraout_var,iVar5);
  compareSrc2 = IR::AddrOpnd::New(pLVar8,AddrOpndKindDynamicVtable,this->m_func,false,(Var)0x0);
  pLVar8 = (Lowerer *)GetRegOpnd(pLVar8,src1,insertInstr,this->m_func,TyVar);
  OVar4 = IR::Opnd::GetKind((Opnd *)pLVar8);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005e1d09;
    *puVar7 = 0;
  }
  this_02 = pLVar8;
  compareSrc1 = IR::IndirOpnd::New((RegOpnd *)pLVar8,0,TyUint64,insertInstr->m_func,false);
  InsertCompareBranch(this_02,&compareSrc1->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,false,
                      labelHelper,insertInstr,false);
  local_3a = (src2->m_valueType).field_0;
  paVar9 = &local_3a;
  bVar3 = ValueType::IsString((ValueType *)&paVar9->field_0);
  if (!bVar3) {
    src2 = &GetRegOpnd((Lowerer *)&paVar9->field_0,src2,insertInstr,this->m_func,TyVar)->super_Opnd;
    OVar4 = IR::Opnd::GetKind(src2);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_005e1d09:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    GenerateStringTest(this,(RegOpnd *)src2,insertInstr,labelHelper,(LabelInstr *)0x0,true);
  }
  this_01 = IR::Instr::New(CALL,insertInstr->m_func);
  if (local_38 != (Opnd *)0x0) {
    IR::Instr::SetDst(this_01,local_38);
  }
  IR::Instr::InsertBefore(insertInstr,this_01);
  if ((insertInstr->field_0x38 & 0x10) != 0) {
    BVar6 = IR::Instr::GetBailOutKind(insertInstr);
    if ((BVar6 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls) {
      bailoutInfo = IR::Instr::GetBailOutInfo(insertInstr);
      BVar6 = IR::Instr::GetBailOutKind(insertInstr);
      this_01 = AddBailoutToHelperCallInstr(this,this_01,bailoutInfo,BVar6,insertInstr);
    }
  }
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,this_01,src2);
  LowererMD::LoadHelperArgument(this_00,this_01,strOpnd);
  LowererMD::LoadHelperArgument(this_00,this_01,(Opnd *)pLVar8);
  LoadScriptContext(this,this_01);
  LowererMD::ChangeToHelperCall
            (this_00,this_01,(local_38 == (Opnd *)0x0) + HelperRegExp_ReplaceStringResultUsed,
             (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastReplace(IR::Opnd* strOpnd, IR::Opnd* src1, IR::Opnd* src2, IR::Instr *callInstr, IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel)
{
    // a.replace(b,c)
    // We want to emit the fast path if 'a' and 'c' are strings and 'b' is a regex
    //
    // strOpnd --> a
    // src1    --> b
    // src2    --> c

    IR::Opnd * callDst = callInstr->GetDst();

    Assert(strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString());

    if(!strOpnd->GetValueType().IsString())
    {
        strOpnd = GetRegOpnd(strOpnd, insertInstr, m_func, TyVar);

        this->GenerateStringTest(strOpnd->AsRegOpnd(), insertInstr, labelHelper);
    }

    if(!src1->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(src1, insertInstr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    src1 = GetRegOpnd(src1, insertInstr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(src1->AsRegOpnd(), 0, TyMachPtr, insertInstr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        insertInstr);

    if(!src2->GetValueType().IsString())
    {
        src2 = GetRegOpnd(src2, insertInstr, m_func, TyVar);
        this->GenerateStringTest(src2->AsRegOpnd(), insertInstr, labelHelper);
    }

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, insertInstr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    insertInstr->InsertBefore(helperCallInstr);

    if (insertInstr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(insertInstr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, insertInstr->GetBailOutInfo(), insertInstr->GetBailOutKind(), insertInstr);
    }

    //scriptContext, pRegEx, pThis, pReplace (to be pushed in reverse order)

    // pReplace, pThis, pRegEx
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, src2);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, strOpnd);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, src1);

    // script context
    LoadScriptContext(helperCallInstr);

    if(callDst)
    {
        m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::JnHelperMethod::HelperRegExp_ReplaceStringResultUsed);
    }
    else
    {
        m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::JnHelperMethod::HelperRegExp_ReplaceStringResultNotUsed);
    }

    return true;
}